

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O3

void Assimp::IFC::ConvertTransformOperator(IfcMatrix4 *out,IfcCartesianTransformationOperator *op)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  IfcCartesianPoint *in;
  IfcDirection *pIVar7;
  long lVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  IfcVector3 loc;
  double local_1a8;
  double local_138;
  double local_128;
  IfcVector3 local_118 [4];
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  IfcVector3 local_90;
  IfcVector3 local_78;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  IfcVector3 local_38;
  
  local_78.x = 0.0;
  local_78.y = 0.0;
  local_78.z = 0.0;
  in = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcCartesianPoint>((op->LocalOrigin).obj);
  ConvertCartesianPoint(&local_78,in);
  local_90.x = 1.0;
  local_90.y = 0.0;
  local_90.z = 0.0;
  local_118[0].x._0_4_ = 0;
  local_118[0].x._4_4_ = 0;
  local_118[0].y._0_4_ = 0;
  local_118[0].y._4_4_ = 0x3ff00000;
  local_118[0].z = 0.0;
  local_38.x = 0.0;
  local_38.y = 0.0;
  local_38.z = 1.0;
  if (op->field_0x38 == '\x01') {
    pIVar7 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcDirection>
                       (*(LazyObject **)&(op->super_IfcGeometricRepresentationItem).field_0x30);
    ConvertDirection(&local_90,pIVar7);
  }
  if ((op->Axis2).have == true) {
    pIVar7 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcDirection>((op->Axis2).ptr.obj);
    ConvertDirection(local_118,pIVar7);
  }
  lVar8 = __dynamic_cast((_func_int *)
                         ((long)&(op->super_IfcGeometricRepresentationItem).
                                 super_IfcRepresentationItem.
                                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                 ._vptr_ObjectHelper +
                         (long)(op->super_IfcGeometricRepresentationItem).
                               super_IfcRepresentationItem.
                               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                               ._vptr_ObjectHelper[-3]),&STEP::Object::typeinfo,
                         &Schema_2x3::IfcCartesianTransformationOperator3D::typeinfo,
                         0xffffffffffffffff);
  local_a0 = 0.0;
  uVar15 = 0;
  uVar17 = 0x3ff00000;
  if (lVar8 == 0) {
    uVar9 = 0;
    uVar12 = 0;
  }
  else {
    uVar9 = 0;
    uVar12 = 0;
    if (*(char *)(lVar8 + 0x80) == '\x01') {
      pIVar7 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcDirection>
                         (*(LazyObject **)(lVar8 + 0x78));
      ConvertDirection(&local_38,pIVar7);
      uVar9 = SUB84(local_38.x,0);
      uVar12 = (undefined4)((ulong)local_38.x >> 0x20);
      uVar15 = SUB84(local_38.z,0);
      uVar17 = (undefined4)((ulong)local_38.z >> 0x20);
      local_a0 = local_38.y;
    }
  }
  dVar20 = local_78.y;
  dVar35 = local_78.x;
  dVar33 = local_90.z;
  dVar5 = local_118[0].z;
  local_98 = local_78.z;
  local_48 = local_90.x;
  uStack_40 = 0;
  out->a1 = local_90.x;
  local_b0 = local_90.y;
  out->b1 = local_90.y;
  out->c1 = local_90.z;
  local_58 = (double)CONCAT44(local_118[0].x._4_4_,local_118[0].x._0_4_);
  uStack_50 = 0;
  out->a2 = local_58;
  local_a8 = (double)CONCAT44(local_118[0].y._4_4_,local_118[0].y._0_4_);
  out->b2 = local_a8;
  out->c2 = local_118[0].z;
  out->a3 = (double)CONCAT44(uVar12,uVar9);
  out->b3 = local_a0;
  out->c3 = (double)CONCAT44(uVar17,uVar15);
  lVar8 = __dynamic_cast((_func_int *)
                         ((long)&(op->super_IfcGeometricRepresentationItem).
                                 super_IfcRepresentationItem.
                                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                 ._vptr_ObjectHelper +
                         (long)(op->super_IfcGeometricRepresentationItem).
                               super_IfcRepresentationItem.
                               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                               ._vptr_ObjectHelper[-3]),&STEP::Object::typeinfo,
                         &Schema_2x3::IfcCartesianTransformationOperator3DnonUniform::typeinfo,
                         0xffffffffffffffff);
  if (lVar8 == 0) {
    if ((op->Scale).have == true) {
      dVar32 = (op->Scale).ptr;
      uVar11 = SUB84(dVar32,0);
      uVar14 = (undefined4)((ulong)dVar32 >> 0x20);
    }
    else {
      uVar11 = 0;
      uVar14 = 0x3ff00000;
    }
    local_138 = (double)CONCAT44(uVar14,uVar11);
    local_1a8 = (double)CONCAT44(uVar14,uVar11);
    local_128 = (double)CONCAT44(uVar14,uVar11);
  }
  else {
    uVar10 = 0;
    uVar13 = 0x3ff00000;
    uVar11 = uVar10;
    uVar14 = uVar13;
    if (*(char *)(lVar8 + 0x60) == '\x01') {
      if ((op->Scale).have == false) {
        __assert_fail("have",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/./code/Step/STEPFile.h"
                      ,0x240,"const T &Assimp::STEP::Maybe<double>::Get() const [T = double]");
      }
      dVar32 = (op->Scale).ptr;
      uVar11 = SUB84(dVar32,0);
      uVar14 = (undefined4)((ulong)dVar32 >> 0x20);
    }
    uVar16 = uVar10;
    uVar18 = uVar13;
    if (*(char *)(lVar8 + 0xa0) == '\x01') {
      uVar16 = (undefined4)*(undefined8 *)(lVar8 + 0x98);
      uVar18 = (undefined4)((ulong)*(undefined8 *)(lVar8 + 0x98) >> 0x20);
    }
    local_128 = (double)CONCAT44(uVar14,uVar11);
    local_138 = (double)CONCAT44(uVar18,uVar16);
    if (*(char *)(lVar8 + 0xb0) == '\x01') {
      uVar10 = (undefined4)*(undefined8 *)(lVar8 + 0xa8);
      uVar13 = (undefined4)((ulong)*(undefined8 *)(lVar8 + 0xa8) >> 0x20);
    }
    local_1a8 = (double)CONCAT44(uVar13,uVar10);
  }
  dVar21 = dVar33 * 0.0;
  dVar32 = out->d1;
  dVar19 = dVar32 * dVar35 + local_48 + local_b0 * 0.0 + dVar21;
  dVar34 = dVar5 * 0.0;
  dVar36 = out->d2;
  dVar30 = dVar36 * dVar35 + local_58 + local_a8 * 0.0 + dVar34;
  dVar24 = (double)CONCAT44(uVar17,uVar15) * 0.0;
  dVar37 = out->d3;
  dVar31 = dVar37 * dVar35 + (double)CONCAT44(uVar12,uVar9) + local_a0 * 0.0 + dVar24;
  dVar40 = out->b4 * 0.0;
  dVar38 = out->c4 * 0.0;
  dVar1 = out->d4;
  dVar27 = dVar35 * dVar1 + out->a4 + dVar40 + dVar38;
  dVar22 = dVar32 * dVar20 + local_b0 + local_48 * 0.0 + dVar21;
  dVar28 = dVar36 * dVar20 + local_a8 + local_58 * 0.0 + dVar34;
  dVar35 = (double)CONCAT44(uVar12,uVar9) * 0.0;
  dVar23 = dVar37 * dVar20 + local_a0 + dVar35 + dVar24;
  dVar25 = out->a4 * 0.0;
  dVar29 = dVar20 * dVar1 + out->b4 + dVar25 + dVar38;
  dVar20 = local_48 * 0.0 + local_b0 * 0.0;
  dVar21 = dVar20 + dVar21 + dVar32;
  dVar26 = dVar32 * local_98 + dVar33 + dVar20;
  dVar33 = local_58 * 0.0 + local_a8 * 0.0;
  dVar34 = dVar33 + dVar34 + dVar36;
  dVar39 = dVar36 * local_98 + dVar5 + dVar33;
  dVar35 = dVar35 + local_a0 * 0.0;
  dVar36 = dVar35 + dVar24 + dVar37;
  dVar37 = dVar37 * local_98 + (double)CONCAT44(uVar17,uVar15) + dVar35;
  dVar25 = dVar25 + dVar40;
  dVar40 = local_98 * dVar1 + out->c4 + dVar25;
  dVar1 = dVar25 + dVar38 + dVar1;
  dVar33 = dVar30 * 0.0;
  dVar20 = dVar19 * 0.0 + dVar33;
  dVar32 = dVar31 * 0.0;
  dVar5 = dVar27 * 0.0;
  dVar33 = dVar5 + dVar32 + dVar19 * local_128 + dVar33;
  dVar35 = dVar5 + dVar32 + dVar19 * 0.0 + dVar30 * local_138;
  auVar2._8_4_ = SUB84(dVar35,0);
  auVar2._0_8_ = dVar33;
  auVar2._12_4_ = (int)((ulong)dVar35 >> 0x20);
  out->a1 = dVar33;
  out->a2 = (double)auVar2._8_8_;
  out->a3 = local_1a8 * dVar31 + dVar20 + dVar5;
  out->a4 = dVar20 + dVar32 + dVar27;
  dVar33 = dVar28 * 0.0;
  dVar20 = dVar22 * 0.0 + dVar33;
  dVar32 = dVar23 * 0.0;
  dVar5 = dVar29 * 0.0;
  dVar33 = dVar5 + dVar32 + dVar22 * local_128 + dVar33;
  dVar35 = dVar5 + dVar32 + dVar22 * 0.0 + dVar28 * local_138;
  auVar3._8_4_ = SUB84(dVar35,0);
  auVar3._0_8_ = dVar33;
  auVar3._12_4_ = (int)((ulong)dVar35 >> 0x20);
  out->b1 = dVar33;
  out->b2 = (double)auVar3._8_8_;
  out->b3 = local_1a8 * dVar23 + dVar20 + dVar5;
  out->b4 = dVar20 + dVar32 + dVar29;
  dVar33 = dVar39 * 0.0;
  dVar20 = dVar26 * 0.0 + dVar33;
  dVar32 = dVar37 * 0.0;
  dVar5 = dVar40 * 0.0;
  dVar33 = dVar5 + dVar32 + dVar26 * local_128 + dVar33;
  dVar35 = dVar5 + dVar32 + dVar26 * 0.0 + dVar39 * local_138;
  auVar4._8_4_ = SUB84(dVar35,0);
  auVar4._0_8_ = dVar33;
  auVar4._12_4_ = (int)((ulong)dVar35 >> 0x20);
  out->c1 = dVar33;
  out->c2 = (double)auVar4._8_8_;
  out->c3 = local_1a8 * dVar37 + dVar20 + dVar5;
  out->c4 = dVar20 + dVar32 + dVar40;
  dVar35 = dVar34 * 0.0;
  dVar5 = dVar36 * 0.0;
  dVar32 = dVar21 * 0.0 + dVar35;
  dVar33 = dVar1 * 0.0;
  dVar35 = dVar33 + dVar5 + dVar21 * local_128 + dVar35;
  dVar20 = dVar33 + dVar5 + dVar21 * 0.0 + dVar34 * local_138;
  auVar6._8_4_ = SUB84(dVar20,0);
  auVar6._0_8_ = dVar35;
  auVar6._12_4_ = (int)((ulong)dVar20 >> 0x20);
  out->d1 = dVar35;
  out->d2 = (double)auVar6._8_8_;
  out->d3 = local_1a8 * dVar36 + dVar32 + dVar33;
  out->d4 = dVar32 + dVar5 + dVar1;
  return;
}

Assistant:

void ConvertTransformOperator(IfcMatrix4& out, const Schema_2x3::IfcCartesianTransformationOperator& op)
{
    IfcVector3 loc;
    ConvertCartesianPoint(loc,op.LocalOrigin);

    IfcVector3 x(1.f,0.f,0.f),y(0.f,1.f,0.f),z(0.f,0.f,1.f);
    if (op.Axis1) {
        ConvertDirection(x,*op.Axis1.Get());
    }
    if (op.Axis2) {
        ConvertDirection(y,*op.Axis2.Get());
    }
    if (const Schema_2x3::IfcCartesianTransformationOperator3D* op2 = op.ToPtr<Schema_2x3::IfcCartesianTransformationOperator3D>()) {
        if(op2->Axis3) {
            ConvertDirection(z,*op2->Axis3.Get());
        }
    }

    IfcMatrix4 locm;
    IfcMatrix4::Translation(loc,locm);
    AssignMatrixAxes(out,x,y,z);


    IfcVector3 vscale;
    if (const Schema_2x3::IfcCartesianTransformationOperator3DnonUniform* nuni = op.ToPtr<Schema_2x3::IfcCartesianTransformationOperator3DnonUniform>()) {
        vscale.x = nuni->Scale?op.Scale.Get():1.f;
        vscale.y = nuni->Scale2?nuni->Scale2.Get():1.f;
        vscale.z = nuni->Scale3?nuni->Scale3.Get():1.f;
    }
    else {
        const IfcFloat sc = op.Scale?op.Scale.Get():1.f;
        vscale = IfcVector3(sc,sc,sc);
    }

    IfcMatrix4 s;
    IfcMatrix4::Scaling(vscale,s);

    out = locm * out * s;
}